

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# swap-reduce.cpp
# Opt level: O0

void verify_block(Block *b,ProxyWithLink *cp)

{
  StringRef capturedExpression;
  StringRef capturedExpression_00;
  StringRef capturedExpression_01;
  StringRef capturedExpression_02;
  int iVar1;
  undefined4 extraout_var;
  size_type sVar2;
  ExprLhs<const_float_&> this;
  char *in_RDX;
  ProxyWithLink *in_RSI;
  long in_RDI;
  AssertionHandler catchAssertionHandler_3;
  AssertionHandler catchAssertionHandler_2;
  uint j_1;
  size_t i;
  AssertionHandler catchAssertionHandler_1;
  AssertionHandler catchAssertionHandler;
  Bounds *core;
  uint j;
  RCLink *link;
  undefined4 in_stack_fffffffffffffc48;
  Flags in_stack_fffffffffffffc4c;
  AssertionHandler *in_stack_fffffffffffffc50;
  SourceLineInfo *in_stack_fffffffffffffc58;
  ExprLhs<const_float_&> in_stack_fffffffffffffc60;
  reference in_stack_fffffffffffffc68;
  size_type in_stack_fffffffffffffc70;
  SourceLineInfo *this_00;
  float *in_stack_fffffffffffffc80;
  ulong uVar3;
  ExprLhs<const_float_&> *in_stack_fffffffffffffc88;
  RegularLink<diy::Bounds<float>_> *local_338;
  SourceLineInfo local_2d8;
  StringRef local_2c8;
  float *local_268;
  SourceLineInfo local_220;
  StringRef local_210;
  uint local_1b4;
  ulong local_1b0;
  float *local_1a0;
  SourceLineInfo local_158;
  StringRef local_148;
  float *local_d8;
  SourceLineInfo local_90;
  StringRef local_80;
  Bounds *local_28;
  uint local_1c;
  RegularLink<diy::Bounds<float>_> *local_18;
  long local_8;
  
  local_8 = in_RDI;
  iVar1 = diy::Master::ProxyWithLink::link(in_RSI,(char *)in_RSI,in_RDX);
  if (CONCAT44(extraout_var,iVar1) == 0) {
    local_338 = (RegularLink<diy::Bounds<float>_> *)0x0;
  }
  else {
    local_338 = (RegularLink<diy::Bounds<float>_> *)
                __dynamic_cast(CONCAT44(extraout_var,iVar1),&diy::Link::typeinfo,
                               &diy::RegularLink<diy::Bounds<float>>::typeinfo,0);
  }
  local_18 = local_338;
  for (local_1c = 0; local_1c < 3; local_1c = local_1c + 1) {
    local_28 = diy::RegularLink<diy::Bounds<float>_>::core(local_18);
    local_80 = operator____catch_sr
                         ((char *)in_stack_fffffffffffffc50,
                          CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
    Catch::SourceLineInfo::SourceLineInfo
              (&local_90,
               "/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/tests/swap-reduce.cpp"
               ,0x81);
    Catch::StringRef::StringRef
              ((StringRef *)in_stack_fffffffffffffc60.m_lhs,(char *)in_stack_fffffffffffffc58);
    capturedExpression.m_size = in_stack_fffffffffffffc70;
    capturedExpression.m_start = (char *)in_stack_fffffffffffffc68;
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)in_stack_fffffffffffffc60.m_lhs,
               (StringRef *)in_stack_fffffffffffffc58,(SourceLineInfo *)in_stack_fffffffffffffc50,
               capturedExpression,in_stack_fffffffffffffc4c);
    itlib::small_vector<float,_4UL,_0UL,_std::allocator<float>_>::operator[]
              ((small_vector<float,_4UL,_0UL,_std::allocator<float>_> *)in_stack_fffffffffffffc50,
               CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
    local_d8 = (float *)Catch::Decomposer::operator<=
                                  ((Decomposer *)
                                   CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48),
                                   (float *)0x14d0bb);
    itlib::small_vector<float,_4UL,_0UL,_std::allocator<float>_>::operator[]
              ((small_vector<float,_4UL,_0UL,_std::allocator<float>_> *)in_stack_fffffffffffffc50,
               CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
    Catch::ExprLhs<float_const&>::operator==(in_stack_fffffffffffffc88,in_stack_fffffffffffffc80);
    Catch::AssertionHandler::handleExpr
              (in_stack_fffffffffffffc50,
               (ITransientExpression *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48)
              );
    Catch::BinaryExpr<const_float_&,_const_float_&>::~BinaryExpr
              ((BinaryExpr<const_float_&,_const_float_&> *)0x14d12c);
    Catch::AssertionHandler::complete(in_stack_fffffffffffffc50);
    Catch::AssertionHandler::~AssertionHandler(in_stack_fffffffffffffc50);
    local_148 = operator____catch_sr
                          ((char *)in_stack_fffffffffffffc50,
                           CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
    Catch::SourceLineInfo::SourceLineInfo
              (&local_158,
               "/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/tests/swap-reduce.cpp"
               ,0x82);
    Catch::StringRef::StringRef
              ((StringRef *)in_stack_fffffffffffffc60.m_lhs,(char *)in_stack_fffffffffffffc58);
    capturedExpression_00.m_size = in_stack_fffffffffffffc70;
    capturedExpression_00.m_start = (char *)in_stack_fffffffffffffc68;
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)in_stack_fffffffffffffc60.m_lhs,
               (StringRef *)in_stack_fffffffffffffc58,(SourceLineInfo *)in_stack_fffffffffffffc50,
               capturedExpression_00,in_stack_fffffffffffffc4c);
    itlib::small_vector<float,_4UL,_0UL,_std::allocator<float>_>::operator[]
              ((small_vector<float,_4UL,_0UL,_std::allocator<float>_> *)in_stack_fffffffffffffc50,
               CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
    local_1a0 = (float *)Catch::Decomposer::operator<=
                                   ((Decomposer *)
                                    CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48),
                                    (float *)0x14d261);
    in_stack_fffffffffffffc88 =
         (ExprLhs<const_float_&> *)
         itlib::small_vector<float,_4UL,_0UL,_std::allocator<float>_>::operator[]
                   ((small_vector<float,_4UL,_0UL,_std::allocator<float>_> *)
                    in_stack_fffffffffffffc50,
                    CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
    Catch::ExprLhs<float_const&>::operator==(in_stack_fffffffffffffc88,in_stack_fffffffffffffc80);
    Catch::AssertionHandler::handleExpr
              (in_stack_fffffffffffffc50,
               (ITransientExpression *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48)
              );
    Catch::BinaryExpr<const_float_&,_const_float_&>::~BinaryExpr
              ((BinaryExpr<const_float_&,_const_float_&> *)0x14d2d6);
    Catch::AssertionHandler::complete(in_stack_fffffffffffffc50);
    Catch::AssertionHandler::~AssertionHandler(in_stack_fffffffffffffc50);
  }
  local_1b0 = 0;
  while( true ) {
    uVar3 = local_1b0;
    sVar2 = Catch::clara::std::
            vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>::size
                      ((vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_> *)
                       (local_8 + 0x100));
    if (sVar2 <= uVar3) break;
    for (local_1b4 = 0; local_1b4 < 3; local_1b4 = local_1b4 + 1) {
      local_210 = operator____catch_sr
                            ((char *)in_stack_fffffffffffffc50,
                             CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
      this_00 = &local_220;
      Catch::SourceLineInfo::SourceLineInfo
                (this_00,
                 "/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/tests/swap-reduce.cpp"
                 ,0x88);
      Catch::StringRef::StringRef
                ((StringRef *)in_stack_fffffffffffffc60.m_lhs,(char *)in_stack_fffffffffffffc58);
      capturedExpression_01.m_size = (size_type)this_00;
      capturedExpression_01.m_start = (char *)in_stack_fffffffffffffc68;
      Catch::AssertionHandler::AssertionHandler
                ((AssertionHandler *)in_stack_fffffffffffffc60.m_lhs,
                 (StringRef *)in_stack_fffffffffffffc58,(SourceLineInfo *)in_stack_fffffffffffffc50,
                 capturedExpression_01,in_stack_fffffffffffffc4c);
      Catch::clara::std::vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>::
      operator[]((vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_> *)
                 (local_8 + 0x100),local_1b0);
      Catch::clara::std::array<float,_3UL>::operator[]
                ((array<float,_3UL> *)in_stack_fffffffffffffc50,
                 CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
      this = Catch::Decomposer::operator<=
                       ((Decomposer *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48),
                        (float *)0x14d50e);
      local_268 = this.m_lhs;
      in_stack_fffffffffffffc68 =
           itlib::small_vector<float,_4UL,_0UL,_std::allocator<float>_>::operator[]
                     ((small_vector<float,_4UL,_0UL,_std::allocator<float>_> *)
                      in_stack_fffffffffffffc50,
                      CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
      Catch::ExprLhs<float_const&>::operator>=
                ((ExprLhs<const_float_&> *)this.m_lhs,(float *)this_00);
      Catch::AssertionHandler::handleExpr
                (in_stack_fffffffffffffc50,
                 (ITransientExpression *)
                 CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
      Catch::BinaryExpr<const_float_&,_const_float_&>::~BinaryExpr
                ((BinaryExpr<const_float_&,_const_float_&> *)0x14d583);
      Catch::AssertionHandler::complete(in_stack_fffffffffffffc50);
      Catch::AssertionHandler::~AssertionHandler(in_stack_fffffffffffffc50);
      local_2c8 = operator____catch_sr
                            ((char *)in_stack_fffffffffffffc50,
                             CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
      in_stack_fffffffffffffc58 = &local_2d8;
      Catch::SourceLineInfo::SourceLineInfo
                (in_stack_fffffffffffffc58,
                 "/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/tests/swap-reduce.cpp"
                 ,0x89);
      Catch::StringRef::StringRef
                ((StringRef *)in_stack_fffffffffffffc60.m_lhs,(char *)in_stack_fffffffffffffc58);
      capturedExpression_02.m_size = (size_type)this_00;
      capturedExpression_02.m_start = (char *)in_stack_fffffffffffffc68;
      Catch::AssertionHandler::AssertionHandler
                ((AssertionHandler *)in_stack_fffffffffffffc60.m_lhs,
                 (StringRef *)in_stack_fffffffffffffc58,(SourceLineInfo *)in_stack_fffffffffffffc50,
                 capturedExpression_02,in_stack_fffffffffffffc4c);
      Catch::clara::std::vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>::
      operator[]((vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_> *)
                 (local_8 + 0x100),local_1b0);
      Catch::clara::std::array<float,_3UL>::operator[]
                ((array<float,_3UL> *)in_stack_fffffffffffffc50,
                 CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
      in_stack_fffffffffffffc60 =
           Catch::Decomposer::operator<=
                     ((Decomposer *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48),
                      (float *)0x14d6bf);
      in_stack_fffffffffffffc50 =
           (AssertionHandler *)
           itlib::small_vector<float,_4UL,_0UL,_std::allocator<float>_>::operator[]
                     ((small_vector<float,_4UL,_0UL,_std::allocator<float>_> *)
                      in_stack_fffffffffffffc50,
                      CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
      Catch::ExprLhs<float_const&>::operator<=
                ((ExprLhs<const_float_&> *)this.m_lhs,(float *)this_00);
      Catch::AssertionHandler::handleExpr
                (in_stack_fffffffffffffc50,
                 (ITransientExpression *)
                 CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
      Catch::BinaryExpr<const_float_&,_const_float_&>::~BinaryExpr
                ((BinaryExpr<const_float_&,_const_float_&> *)0x14d737);
      Catch::AssertionHandler::complete(in_stack_fffffffffffffc50);
      Catch::AssertionHandler::~AssertionHandler(in_stack_fffffffffffffc50);
    }
    local_1b0 = local_1b0 + 1;
  }
  return;
}

Assistant:

void          verify_block(Block* b,
                           const diy::Master::ProxyWithLink& cp) // communication proxy
{
    const RCLink* link = dynamic_cast<RCLink*>(cp.link());

    for (unsigned j = 0; j < DIM; ++j)
    {
        const Bounds& core = link->core();
        CHECK(b->box.min[j] == core.min[j]);
        CHECK(b->box.max[j] == core.max[j]);
    }

    for (size_t i = 0; i < b->points.size(); ++i)
        for (unsigned j = 0; j < DIM; ++j)
        {
            CHECK(b->points[i][j] >= b->box.min[j]);
            CHECK(b->points[i][j] <= b->box.max[j]);
        }
}